

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::majorUpdate(HEkkDual *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long in_RDI;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double *in_stack_00000020;
  string *in_stack_00000028;
  HEkk *in_stack_00000030;
  HEkkDual *in_stack_00000050;
  HighsInt iRow_Out;
  HVector *iColumn;
  MFinish *iFinish;
  HighsInt iFn;
  HEkkDual *in_stack_00000110;
  HEkkDual *in_stack_00000160;
  undefined7 in_stack_ffffffffffffff80;
  byte in_stack_ffffffffffffff87;
  HEkkDual *in_stack_ffffffffffffffa0;
  HEkkDual *in_stack_ffffffffffffffb0;
  string local_48 [24];
  HEkkDual *in_stack_ffffffffffffffd0;
  int local_c;
  
  if (*(int *)(in_RDI + 0xe8) != 0) {
    *(undefined4 *)(in_RDI + 0x14d4) = 1;
  }
  if (*(int *)(in_RDI + 0x14d4) != 0) {
    majorUpdateFtranPrepare(in_stack_ffffffffffffffd0);
    majorUpdateFtranParallel(in_stack_00000110);
    majorUpdateFtranFinal(in_stack_00000050);
    for (local_c = 0; local_c < *(int *)(in_RDI + 0x14cc); local_c = local_c + 1) {
      lVar1 = in_RDI + 0x2718 + (long)local_c * 0x78;
      lVar3 = *(long *)(lVar1 + 0x68);
      iVar2 = *(int *)(lVar1 + 0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_48,"HEkkDual::majorUpdate",(allocator *)&stack0xffffffffffffffb7);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(lVar3 + 0x20),(long)iVar2);
      in_stack_ffffffffffffff87 =
           HEkk::reinvertOnNumericalTrouble
                     (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                      in_stack_00000010,in_stack_00000008);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
      if ((in_stack_ffffffffffffff87 & 1) != 0) {
        *(undefined4 *)(in_RDI + 0xe8) = 7;
        majorRollback(in_stack_ffffffffffffffb0);
        return;
      }
    }
    majorUpdatePrimal(in_stack_00000160);
    majorUpdateFactor(in_stack_ffffffffffffffa0);
    if ((*(byte *)(in_RDI + 8) & 1) != 0) {
      initialiseDevexFramework(in_stack_ffffffffffffffa0);
    }
    iterationAnalysisMajor
              ((HEkkDual *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  }
  return;
}

Assistant:

void HEkkDual::majorUpdate() {
  /**
   * 0. See if it's ready to perform a major update
   */
  if (rebuild_reason) multi_chooseAgain = 1;
  if (!multi_chooseAgain) return;

  // Major update - FTRANs
  majorUpdateFtranPrepare();
  majorUpdateFtranParallel();
  majorUpdateFtranFinal();

  // Major update - check for roll back
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* iFinish = &multi_finish[iFn];
    HVector* iColumn = iFinish->col_aq;
    HighsInt iRow_Out = iFinish->row_out;

    // Use the two pivot values to identify numerical trouble
    if (ekk_instance_.reinvertOnNumericalTrouble(
            "HEkkDual::majorUpdate", numericalTrouble, iColumn->array[iRow_Out],
            iFinish->alpha_row, kMultiNumericalTroubleTolerance)) {
      // HighsInt startUpdate = ekk_instance_.info_.update_count -
      // multi_nFinish;
      rebuild_reason = kRebuildReasonPossiblySingularBasis;
      // if (startUpdate > 0) {
      majorRollback();
      return;
      // }
    }
  }

  // Major update - primal and factor
  majorUpdatePrimal();
  majorUpdateFactor();
  if (new_devex_framework) initialiseDevexFramework();
  iterationAnalysisMajor();
}